

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreprocessorTests.cpp
# Opt level: O1

bool lexCellDefine(string_view text)

{
  SourceManager *sourceManager;
  long lVar1;
  Diagnostic *__location;
  string_view name;
  StringRef macroName;
  StringRef capturedExpression;
  Token token;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  arrays;
  Preprocessor preprocessor;
  Token local_458;
  AssertionHandler local_448;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  ITransientExpression local_3e0;
  Token *local_3d0;
  Preprocessor local_3c8;
  
  if (DAT_00cdc828 != 0) {
    lVar1 = DAT_00cdc828 * 0x70;
    __location = slang::diagnostics;
    do {
      std::ranges::__destroy_at_fn::operator()<slang::Diagnostic>
                ((__destroy_at_fn *)&std::ranges::destroy_at,__location);
      __location = __location + 1;
      lVar1 = lVar1 + -0x70;
    } while (lVar1 != 0);
  }
  DAT_00cdc828 = 0;
  sourceManager = getSourceManager();
  local_448.m_assertionInfo.lineInfo.line = 0;
  local_448.m_assertionInfo.macroName.m_start = (char *)0x3f;
  local_448.m_assertionInfo.macroName.m_size = 1;
  local_448.m_assertionInfo.lineInfo.file = "";
  local_448.m_assertionInfo.capturedExpression.m_start = (char *)0x0;
  local_448.m_assertionInfo.capturedExpression.m_size = 0;
  local_3f8 = 0;
  uStack_3f0 = 0;
  slang::parsing::Preprocessor::Preprocessor
            (&local_3c8,sourceManager,(BumpAllocator *)slang::alloc,
             (Diagnostics *)&slang::diagnostics,(Bag *)&local_448,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)&local_448);
  name._M_str = "source";
  name._M_len = 6;
  slang::parsing::Preprocessor::pushSource(&local_3c8,text,name);
  local_458 = slang::parsing::Preprocessor::next(&local_3c8);
  local_3e0._vptr_ITransientExpression = (_func_int **)0xa0c36c;
  local_3e0.m_isBinaryExpression = true;
  local_3e0.m_result = true;
  local_3e0._10_6_ = 0;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 5;
  capturedExpression.m_start = "token";
  Catch::AssertionHandler::AssertionHandler
            (&local_448,macroName,(SourceLineInfo *)&local_3e0,capturedExpression,Normal);
  local_3d0 = &local_458;
  local_3e0._8_8_ = (ulong)CONCAT61(local_3e0._10_6_,local_458.info != (Info *)0x0) << 8;
  local_3e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00cb5f88;
  Catch::AssertionHandler::handleExpr(&local_448,&local_3e0);
  Catch::AssertionHandler::complete(&local_448);
  if (local_448.m_completed == false) {
    (*(local_448.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  slang::parsing::Preprocessor::~Preprocessor(&local_3c8);
  return local_3c8.cellDefine;
}

Assistant:

bool lexCellDefine(std::string_view text) {
    diagnostics.clear();

    Preprocessor preprocessor(getSourceManager(), alloc, diagnostics);
    preprocessor.pushSource(text);

    Token token = preprocessor.next();
    REQUIRE(token);
    return preprocessor.getCellDefine();
}